

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

double trng::math::detail::GammaQ_asympt<double>(double a,double x)

{
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double in_XMM1_Qa;
  double correction;
  double leading;
  double eta;
  double eta_squared_half;
  double mu;
  double in_stack_000000d0;
  double in_stack_000000d8;
  double in_stack_000000e0;
  
  dVar1 = (in_XMM1_Qa - in_XMM0_Qa) / in_XMM0_Qa;
  dVar2 = mln1p<double>(dVar1);
  dVar2 = sqrt(dVar2 * 2.0);
  dVar3 = sqrt(in_XMM0_Qa / 2.0);
  dVar1 = erfc((double)((ulong)ABS(dVar2) | (ulong)dVar1 & 0x8000000000000000) * dVar3);
  dVar2 = GammaPQ_asympt_R<double>(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
  return dVar1 / 2.0 + dVar2;
}

Assistant:

TRNG_CUDA_ENABLE T GammaQ_asympt(T a, T x) {
        const T mu{(x - a) / a};
        const T eta_squared_half{mln1p(mu)};
        const T eta{copysign(sqrt(2 * eta_squared_half), mu)};
        const T leading{erfc(eta * sqrt(a / 2)) / 2};
        const T correction{GammaPQ_asympt_R(a, eta, eta_squared_half)};
        return leading + correction;
      }